

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

Texture * __thiscall nite::Texture::operator=(Texture *this,Texture *other)

{
  float fVar1;
  reference pvVar2;
  Texture *local_28;
  Texture *local_20;
  Texture *other_local;
  Texture *this_local;
  
  if ((uint)other->objectId < 0x80000000) {
    local_20 = other;
    other_local = this;
    unload(this);
    this->scale = local_20->scale;
    fVar1 = (local_20->region).y;
    (this->region).x = (local_20->region).x;
    (this->region).y = fVar1;
    fVar1 = (local_20->region).h;
    (this->region).w = (local_20->region).w;
    (this->region).h = fVar1;
    this->smooth = (bool)(local_20->smooth & 1);
    this->objectId = local_20->objectId;
    std::__cxx11::string::operator=((string *)this,(string *)local_20);
    pvVar2 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                       (&textureList,(long)this->objectId);
    local_28 = this;
    std::vector<nite::Texture_*,_std::allocator<nite::Texture_*>_>::push_back
              (&pvVar2->owners,&local_28);
  }
  return this;
}

Assistant:

nite::Texture& nite::Texture::operator= (const nite::Texture &other){
	if(other.objectId <= -1) return *this;
	unload();
	scale = other.scale;
	region = other.region;
	smooth = other.smooth;
	objectId = other.objectId;
	filename = other.filename;
	textureList[objectId].owners.push_back(this);
	return *this;
}